

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.c
# Opt level: O2

int epoll_apply_one_change(event_base *base,epollop *epollop,event_change *ch)

{
  byte bVar1;
  byte bVar2;
  short sVar3;
  undefined4 uVar4;
  int iVar5;
  int iVar6;
  int *piVar7;
  uint *puVar8;
  char *pcVar9;
  char *pcVar10;
  uint uVar11;
  uint uVar12;
  char *pcVar13;
  undefined1 local_4c [24];
  uint local_34;
  
  bVar1 = *(byte *)((long)&epollop->events + 6);
  bVar2 = *(byte *)((long)&epollop->events + 7);
  uVar11 = (uint)*(short *)((long)&epollop->events + 4);
  uVar11 = ((uVar11 & 6) << 5 | (bVar2 & 3) << 4 | ((byte)epollop->nevents & 3) + (bVar1 & 3) * 4) +
           (uVar11 & 0x80) * 2;
  iVar6 = epoll_op_table[uVar11].op;
  if (epoll_op_table[uVar11].events == 0) {
    if (iVar6 == 0) {
      return 0;
    }
    event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/epoll.c"
               ,0x118,"op == 0","epoll_apply_one_change");
  }
  local_4c._0_4_ = ((bVar2 | bVar1) & 0xffffffe0) << 0x1a | epoll_op_table[uVar11].events;
  local_4c._8_4_ = 0;
  local_4c._4_4_ = *(undefined4 *)&epollop->events;
  iVar5 = epoll_ctl(*(int *)((long)&base->evbase + 4),iVar6,local_4c._4_4_,(epoll_event *)local_4c);
  uVar4 = local_4c._0_4_;
  if (iVar5 == 0) {
    if (event_debug_logging_mask_ == 0) {
      return 0;
    }
    if (iVar6 == 1) {
      pcVar13 = "ADD";
    }
    else if (iVar6 == 2) {
      pcVar13 = "DEL";
    }
    else {
      pcVar13 = "???";
      if (iVar6 == 3) {
        pcVar13 = "MOD";
      }
    }
    uVar11 = *(uint *)&epollop->events;
    local_34 = (uint)*(short *)((long)&epollop->events + 4);
    uVar12 = (uint)*(byte *)((long)&epollop->events + 6);
    local_4c._12_8_ = change_to_string(uVar12);
    bVar1 = *(byte *)((long)&epollop->events + 7);
    pcVar9 = change_to_string((uint)bVar1);
    bVar2 = (byte)epollop->nevents;
    pcVar10 = change_to_string((uint)bVar2);
    event_debugx_("Epoll %s(%d) on fd %d okay. Old events were %d; read change was %d (%s); write change was %d (%s); close change was %d (%s)"
                  ,pcVar13,(ulong)(uint)uVar4,(ulong)uVar11,(ulong)local_34,(ulong)uVar12,
                  local_4c._12_8_,(ulong)bVar1,pcVar9,(ulong)bVar2,pcVar10);
    return 0;
  }
  if (iVar6 == 1) {
    piVar7 = __errno_location();
    if (*piVar7 == 0x11) {
      iVar6 = epoll_ctl(*(int *)((long)&base->evbase + 4),3,*(int *)&epollop->events,
                        (epoll_event *)local_4c);
      if (iVar6 != -1) {
        if (event_debug_logging_mask_ == 0) {
          return 0;
        }
        uVar11 = *(uint *)&epollop->events;
        pcVar13 = "Epoll ADD(%d) on %d retried as MOD; succeeded.";
LAB_00207c7a:
        event_debugx_(pcVar13,(ulong)(uint)local_4c._0_4_,(ulong)uVar11);
        return 0;
      }
      uVar11 = *(uint *)&epollop->events;
      pcVar13 = "Epoll ADD(%d) on %d retried as MOD; that failed too";
LAB_00207dd6:
      event_warn(pcVar13,(ulong)(uint)local_4c._0_4_,(ulong)uVar11);
      return -1;
    }
    pcVar13 = "ADD";
  }
  else if (iVar6 == 2) {
    puVar8 = (uint *)__errno_location();
    uVar4 = local_4c._0_4_;
    uVar11 = *puVar8;
    pcVar13 = "DEL";
    if ((uVar11 < 10) && ((0x206U >> (uVar11 & 0x1f) & 1) != 0)) {
      if (event_debug_logging_mask_ == 0) {
        return 0;
      }
      uVar12 = *(uint *)&epollop->events;
      pcVar13 = strerror(uVar11);
      event_debugx_("Epoll DEL(%d) on fd %d gave %s: DEL was unnecessary.",(ulong)(uint)uVar4,
                    (ulong)uVar12,pcVar13);
      return 0;
    }
  }
  else {
    if ((iVar6 == 3) && (piVar7 = __errno_location(), *piVar7 == 2)) {
      iVar6 = epoll_ctl(*(int *)((long)&base->evbase + 4),1,*(int *)&epollop->events,
                        (epoll_event *)local_4c);
      if (iVar6 != -1) {
        if (event_debug_logging_mask_ == 0) {
          return 0;
        }
        uVar11 = *(uint *)&epollop->events;
        pcVar13 = "Epoll MOD(%d) on %d retried as ADD; succeeded.";
        goto LAB_00207c7a;
      }
      uVar11 = *(uint *)&epollop->events;
      pcVar13 = "Epoll MOD(%d) on %d retried as ADD; that failed too";
      goto LAB_00207dd6;
    }
    pcVar13 = "???";
    if (iVar6 == 3) {
      pcVar13 = "MOD";
    }
  }
  uVar4 = local_4c._0_4_;
  uVar11 = *(uint *)&epollop->events;
  sVar3 = *(short *)((long)&epollop->events + 4);
  uVar12 = (uint)*(byte *)((long)&epollop->events + 6);
  local_4c._12_8_ = change_to_string(uVar12);
  bVar1 = *(byte *)((long)&epollop->events + 7);
  pcVar9 = change_to_string((uint)bVar1);
  bVar2 = (byte)epollop->nevents;
  pcVar10 = change_to_string((uint)bVar2);
  event_warn("Epoll %s(%d) on fd %d failed. Old events were %d; read change was %d (%s); write change was %d (%s); close change was %d (%s)"
             ,pcVar13,(ulong)(uint)uVar4,(ulong)uVar11,(ulong)(uint)(int)sVar3,(ulong)uVar12,
             local_4c._12_8_,(ulong)bVar1,pcVar9,(ulong)bVar2,pcVar10);
  return -1;
}

Assistant:

static int
epoll_apply_one_change(struct event_base *base,
    struct epollop *epollop,
    const struct event_change *ch)
{
	struct epoll_event epev;
	int op, events = 0;
	int idx;

	idx = EPOLL_OP_TABLE_INDEX(ch);
	op = epoll_op_table[idx].op;
	events = epoll_op_table[idx].events;

	if (!events) {
		EVUTIL_ASSERT(op == 0);
		return 0;
	}

	if ((ch->read_change|ch->write_change) & EV_CHANGE_ET)
		events |= EPOLLET;

	memset(&epev, 0, sizeof(epev));
	epev.data.fd = ch->fd;
	epev.events = events;
	if (epoll_ctl(epollop->epfd, op, ch->fd, &epev) == 0) {
		event_debug((PRINT_CHANGES(op, epev.events, ch, "okay")));
		return 0;
	}

	switch (op) {
	case EPOLL_CTL_MOD:
		if (errno == ENOENT) {
			/* If a MOD operation fails with ENOENT, the
			 * fd was probably closed and re-opened.  We
			 * should retry the operation as an ADD.
			 */
			if (epoll_ctl(epollop->epfd, EPOLL_CTL_ADD, ch->fd, &epev) == -1) {
				event_warn("Epoll MOD(%d) on %d retried as ADD; that failed too",
				    (int)epev.events, ch->fd);
				return -1;
			} else {
				event_debug(("Epoll MOD(%d) on %d retried as ADD; succeeded.",
					(int)epev.events,
					ch->fd));
				return 0;
			}
		}
		break;
	case EPOLL_CTL_ADD:
		if (errno == EEXIST) {
			/* If an ADD operation fails with EEXIST,
			 * either the operation was redundant (as with a
			 * precautionary add), or we ran into a fun
			 * kernel bug where using dup*() to duplicate the
			 * same file into the same fd gives you the same epitem
			 * rather than a fresh one.  For the second case,
			 * we must retry with MOD. */
			if (epoll_ctl(epollop->epfd, EPOLL_CTL_MOD, ch->fd, &epev) == -1) {
				event_warn("Epoll ADD(%d) on %d retried as MOD; that failed too",
				    (int)epev.events, ch->fd);
				return -1;
			} else {
				event_debug(("Epoll ADD(%d) on %d retried as MOD; succeeded.",
					(int)epev.events,
					ch->fd));
				return 0;
			}
		}
		break;
	case EPOLL_CTL_DEL:
		if (errno == ENOENT || errno == EBADF || errno == EPERM) {
			/* If a delete fails with one of these errors,
			 * that's fine too: we closed the fd before we
			 * got around to calling epoll_dispatch. */
			event_debug(("Epoll DEL(%d) on fd %d gave %s: DEL was unnecessary.",
				(int)epev.events,
				ch->fd,
				strerror(errno)));
			return 0;
		}
		break;
	default:
		break;
	}

	event_warn(PRINT_CHANGES(op, epev.events, ch, "failed"));
	return -1;
}